

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateAddAlias(HelicsFederate fed,char *interfaceName,char *alias,HelicsError *err)

{
  Federate *this;
  FedObject *pFVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  string_view interfaceName_00;
  string_view alias_00;
  
  pFVar1 = helics::getFedObject(fed,err);
  if (pFVar1 == (FedObject *)0x0) {
    return;
  }
  this = (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this != (Federate *)0x0) {
    if ((interfaceName == (char *)0x0) || (*interfaceName == '\0')) {
      if (err == (HelicsError *)0x0) {
        return;
      }
      err->error_code = -4;
      pcVar4 = "Interface name cannot be empty";
    }
    else {
      if ((alias != (char *)0x0) && (*alias != '\0')) {
        sVar2 = strlen(interfaceName);
        sVar3 = strlen(alias);
        interfaceName_00._M_str = interfaceName;
        interfaceName_00._M_len = sVar2;
        alias_00._M_str = alias;
        alias_00._M_len = sVar3;
        helics::Federate::addAlias(this,interfaceName_00,alias_00);
        return;
      }
      if (err == (HelicsError *)0x0) {
        return;
      }
      err->error_code = -4;
      pcVar4 = "Alias cannot be empty";
    }
    err->message = pcVar4;
    return;
  }
  return;
}

Assistant:

void helicsFederateAddAlias(HelicsFederate fed, const char* interfaceName, const char* alias, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    if (interfaceName == nullptr || interfaceName[0] == '\0') {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidInterfaceName);
        return;
    }
    if (alias == nullptr || alias[0] == '\0') {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidAliasName);
        return;
    }
    try {
        fedObj->addAlias(interfaceName, alias);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}